

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_batch_test.cc
# Opt level: O3

void __thiscall leveldb::_Test_Multiple::_Run(_Test_Multiple *this)

{
  WriteBatch *b;
  WriteBatch batch;
  int local_1f4;
  string local_1f0;
  WriteBatch local_1d0;
  Tester local_1b0;
  
  WriteBatch::WriteBatch(&local_1d0);
  local_1b0._0_8_ = "foo";
  local_1b0.fname_ = (char *)0x3;
  local_1f0._M_dataplus._M_p = "bar";
  local_1f0._M_string_length = 3;
  WriteBatch::Put(&local_1d0,(Slice *)&local_1b0,(Slice *)&local_1f0);
  local_1b0._0_8_ = "box";
  local_1b0.fname_ = (char *)0x3;
  WriteBatch::Delete(&local_1d0,(Slice *)&local_1b0);
  local_1b0._0_8_ = "baz";
  local_1b0.fname_ = (char *)0x3;
  local_1f0._M_dataplus._M_p = "boo";
  local_1f0._M_string_length = 3;
  WriteBatch::Put(&local_1d0,(Slice *)&local_1b0,(Slice *)&local_1f0);
  WriteBatchInternal::SetSequence(&local_1d0,100);
  local_1b0.ok_ = true;
  local_1b0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/write_batch_test.cc"
  ;
  local_1b0.line_ = 0x45;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1b0 + 0x18));
  local_1f4 = 100;
  local_1f0._M_dataplus._M_p = (pointer)WriteBatchInternal::Sequence(&local_1d0);
  test::Tester::IsEq<int,unsigned_long>(&local_1b0,&local_1f4,(unsigned_long *)&local_1f0);
  test::Tester::~Tester(&local_1b0);
  local_1b0.ok_ = true;
  local_1b0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/write_batch_test.cc"
  ;
  local_1b0.line_ = 0x46;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1b0 + 0x18));
  local_1f0._M_dataplus._M_p._0_4_ = 3;
  local_1f4 = WriteBatchInternal::Count(&local_1d0);
  test::Tester::IsEq<int,int>(&local_1b0,(int *)&local_1f0,&local_1f4);
  test::Tester::~Tester(&local_1b0);
  local_1b0.ok_ = true;
  local_1b0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/write_batch_test.cc"
  ;
  local_1b0.line_ = 0x4b;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1b0 + 0x18));
  PrintContents_abi_cxx11_(&local_1f0,(leveldb *)&local_1d0,b);
  test::Tester::IsEq<char[50],std::__cxx11::string>
            (&local_1b0,(char (*) [50])"Put(baz, boo)@102Delete(box)@101Put(foo, bar)@100",
             &local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1b0);
  WriteBatch::~WriteBatch(&local_1d0);
  return;
}

Assistant:

TEST(WriteBatchTest, Multiple) {
  WriteBatch batch;
  batch.Put(Slice("foo"), Slice("bar"));
  batch.Delete(Slice("box"));
  batch.Put(Slice("baz"), Slice("boo"));
  WriteBatchInternal::SetSequence(&batch, 100);
  ASSERT_EQ(100, WriteBatchInternal::Sequence(&batch));
  ASSERT_EQ(3, WriteBatchInternal::Count(&batch));
  ASSERT_EQ(
      "Put(baz, boo)@102"
      "Delete(box)@101"
      "Put(foo, bar)@100",
      PrintContents(&batch));
}